

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

IceTBoolean icetMatrixInverse(IceTDouble *matrix_in,IceTDouble *matrix_out)

{
  undefined8 uVar1;
  double dVar2;
  int local_154;
  int columnIdx_2;
  IceTDouble old_elim_value;
  IceTDouble scale_value;
  int local_138;
  int columnIdx_1;
  int pivotIdx;
  int columnIdx;
  int rowIdx;
  int eliminationIdx;
  IceTDouble matrix [4] [8];
  IceTDouble *matrix_out_local;
  IceTDouble *matrix_in_local;
  
  for (pivotIdx = 0; pivotIdx < 4; pivotIdx = pivotIdx + 1) {
    for (columnIdx_1 = 0; columnIdx_1 < 4; columnIdx_1 = columnIdx_1 + 1) {
      *(IceTDouble *)(&rowIdx + (long)pivotIdx * 0x10 + (long)columnIdx_1 * 2) =
           matrix_in[columnIdx_1 * 4 + pivotIdx];
    }
    for (columnIdx_1 = 4; columnIdx_1 < 8; columnIdx_1 = columnIdx_1 + 1) {
      (&rowIdx + (long)pivotIdx * 0x10 + (long)columnIdx_1 * 2)[0] = 0;
      (&rowIdx + (long)pivotIdx * 0x10 + (long)columnIdx_1 * 2)[1] = 0;
    }
    (&rowIdx + (long)pivotIdx * 0x10 + (long)(pivotIdx + 4) * 2)[0] = 0;
    (&rowIdx + (long)pivotIdx * 0x10 + (long)(pivotIdx + 4) * 2)[1] = 0x3ff00000;
  }
  columnIdx = 0;
  while( true ) {
    if (3 < columnIdx) {
      for (pivotIdx = 0; pivotIdx < 4; pivotIdx = pivotIdx + 1) {
        for (local_154 = 0; local_154 < 4; local_154 = local_154 + 1) {
          matrix_out[local_154 * 4 + pivotIdx] =
               *(IceTDouble *)(&rowIdx + (long)pivotIdx * 0x10 + (long)(local_154 + 4) * 2);
        }
      }
      return '\x01';
    }
    local_138 = columnIdx;
    pivotIdx = columnIdx;
    while (pivotIdx = pivotIdx + 1, pivotIdx < 4) {
      if (ABS(*(double *)(&rowIdx + (long)local_138 * 0x10 + (long)columnIdx * 2)) <
          ABS(*(double *)(&rowIdx + (long)pivotIdx * 0x10 + (long)columnIdx * 2))) {
        local_138 = pivotIdx;
      }
    }
    if ((*(double *)(&rowIdx + (long)local_138 * 0x10 + (long)columnIdx * 2) == 0.0) &&
       (!NAN(*(double *)(&rowIdx + (long)local_138 * 0x10 + (long)columnIdx * 2)))) break;
    if (local_138 != columnIdx) {
      for (scale_value._4_4_ = 0; scale_value._4_4_ < 8; scale_value._4_4_ = scale_value._4_4_ + 1)
      {
        uVar1 = *(undefined8 *)(&rowIdx + (long)columnIdx * 0x10 + (long)scale_value._4_4_ * 2);
        *(undefined8 *)(&rowIdx + (long)columnIdx * 0x10 + (long)scale_value._4_4_ * 2) =
             *(undefined8 *)(&rowIdx + (long)local_138 * 0x10 + (long)scale_value._4_4_ * 2);
        *(undefined8 *)(&rowIdx + (long)local_138 * 0x10 + (long)scale_value._4_4_ * 2) = uVar1;
      }
    }
    dVar2 = *(double *)(&rowIdx + (long)columnIdx * 0x10 + (long)columnIdx * 2);
    for (scale_value._4_4_ = columnIdx; scale_value._4_4_ < 8;
        scale_value._4_4_ = scale_value._4_4_ + 1) {
      *(double *)(&rowIdx + (long)columnIdx * 0x10 + (long)scale_value._4_4_ * 2) =
           (1.0 / dVar2) *
           *(double *)(&rowIdx + (long)columnIdx * 0x10 + (long)scale_value._4_4_ * 2);
    }
    for (pivotIdx = 0; pivotIdx < 4; pivotIdx = pivotIdx + 1) {
      if (pivotIdx != columnIdx) {
        dVar2 = *(double *)(&rowIdx + (long)pivotIdx * 0x10 + (long)columnIdx * 2);
        for (scale_value._4_4_ = columnIdx; scale_value._4_4_ < 8;
            scale_value._4_4_ = scale_value._4_4_ + 1) {
          *(double *)(&rowIdx + (long)pivotIdx * 0x10 + (long)scale_value._4_4_ * 2) =
               -dVar2 * *(double *)(&rowIdx + (long)columnIdx * 0x10 + (long)scale_value._4_4_ * 2)
               + *(double *)(&rowIdx + (long)pivotIdx * 0x10 + (long)scale_value._4_4_ * 2);
        }
      }
    }
    columnIdx = columnIdx + 1;
  }
  return '\0';
}

Assistant:

IceTBoolean icetMatrixInverse(const IceTDouble *matrix_in,
                              IceTDouble *matrix_out)
{
    /* A 4x8 matrix we will do operations on.  The matrix starts as matrix_in
     * adjoined with the identity matrix.  We then do Gaussian elimination and
     * back substitution on the matrix that will result with the identity matrix
     * adjoined with the inverse of the original matrix. */
    IceTDouble matrix[4][8];
    int eliminationIdx;
    int rowIdx;

    /* Initialize the matrix. */
    for (rowIdx = 0; rowIdx < 4; rowIdx++) {
        int columnIdx;
        /* Left half is equal to matrix_in. */
        for (columnIdx = 0; columnIdx < 4; columnIdx++) {
            matrix[rowIdx][columnIdx] = MAT(matrix_in, rowIdx, columnIdx);
        }
        /* Right half is the identity matrix. */
        for (columnIdx = 4; columnIdx < 8; columnIdx++) {
            matrix[rowIdx][columnIdx] = 0.0;
        }
        matrix[rowIdx][rowIdx+4] = 1.0;
    }

    /* Per the Gaussian elimination algorithm, starting at the top row make
     * the leftmost value 1 and zero out the column on all lower rows.  Repeat
     * to rows on down.  If a column will all remaining zeros is encountered,
     * no inverse exists so return failure. */
    for (eliminationIdx = 0; eliminationIdx < 4; eliminationIdx++)
    {
        int pivotIdx;
        int columnIdx;
        IceTDouble scale_value;

        /* Choose the pivot row as the one with the highest absolute value in
         * the elimination column. */
        pivotIdx = eliminationIdx;
        for (rowIdx = eliminationIdx+1; rowIdx < 4; rowIdx++) {
            if (  fabs(matrix[pivotIdx][eliminationIdx])
                < fabs(matrix[rowIdx][eliminationIdx]) ) {
                pivotIdx = rowIdx;
            }
        }

        /* If the entry in pivotIdx is 0, then all the values in the column must
         * be zero and no inverse exists. */
        if (matrix[pivotIdx][eliminationIdx] == 0.0) return ICET_FALSE;

        /* Swap the elimination row with the pivot row to make the pivot row the
         * elimination row. */
        if (pivotIdx != eliminationIdx) {
            for (columnIdx = 0; columnIdx < 8; columnIdx++) {
                IceTDouble old_elim_value = matrix[eliminationIdx][columnIdx];
                matrix[eliminationIdx][columnIdx] = matrix[pivotIdx][columnIdx];
                matrix[pivotIdx][columnIdx] = old_elim_value;
            }
        }

        /* Size the elimination row to scale the eliminationIdx column to 1. */
        scale_value = 1.0/matrix[eliminationIdx][eliminationIdx];
        for (columnIdx = eliminationIdx; columnIdx < 8; columnIdx++) {
            matrix[eliminationIdx][columnIdx] *= scale_value;
        }

        /* Add a multiple of the elimination row to all other rows to zero out
         * that column of values.  Note that this is also doing back-propagation
         * as it is zeroing out values above. */
        for (rowIdx = 0; rowIdx < 4; rowIdx++) {
            if (rowIdx == eliminationIdx) continue;
            scale_value = -matrix[rowIdx][eliminationIdx];
            for (columnIdx = eliminationIdx; columnIdx < 8; columnIdx++) {
                matrix[rowIdx][columnIdx]
                    += scale_value*matrix[eliminationIdx][columnIdx];
            }
        }
    }

    /* At this point, the left 4x4 submatrix of matrix should be the identity
     * matrix and the right 4x4 submatrix is the inverse of matrix_in.  Copy the
     * result to matrix_out. */
    for (rowIdx = 0; rowIdx < 4; rowIdx++) {
        int columnIdx;
        for (columnIdx = 0; columnIdx < 4; columnIdx++) {
            MAT(matrix_out, rowIdx, columnIdx) = matrix[rowIdx][columnIdx+4];
        }
    }

    return ICET_TRUE;
}